

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O0

void __thiscall
CMerkleBlock::CMerkleBlock
          (CMerkleBlock *this,CBlock *block,CBloomFilter *filter,
          set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *txids)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  long in_RCX;
  uint *in_RDX;
  CTransaction *in_RDI;
  long in_FS_OFFSET;
  Txid *hash;
  uint i;
  vector<uint256,_std::allocator<uint256>_> vHashes;
  vector<bool,_std::allocator<bool>_> vMatch;
  CTransaction *in_stack_fffffffffffffe78;
  key_type *in_stack_fffffffffffffe80;
  CBlock *in_stack_fffffffffffffe88;
  uint *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  size_type in_stack_fffffffffffffeb0;
  vector<bool,_std::allocator<bool>_> *vMatch_00;
  uchar *vTxid;
  CTransaction *tx;
  undefined4 in_stack_ffffffffffffff10;
  uint uVar4;
  CPartialMerkleTree local_d0;
  vector<bool,_std::allocator<bool>_> local_80;
  pointer local_58;
  _Bit_type *p_Stack_50;
  pointer local_48;
  pointer pCStack_40;
  pointer local_38;
  pointer pCStack_30;
  pointer local_28;
  pointer puStack_20;
  pointer local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tx = in_RDI;
  CBlockHeader::CBlockHeader((CBlockHeader *)in_stack_fffffffffffffe78);
  vTxid = (in_RDI->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x17;
  CPartialMerkleTree::CPartialMerkleTree((CPartialMerkleTree *)in_stack_fffffffffffffe78);
  std::vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
  ::vector((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
            *)in_stack_fffffffffffffe78);
  CBlock::GetBlockHeader(in_stack_fffffffffffffe88);
  *(pointer *)((in_RDI->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 7) = local_18;
  *(undefined8 *)((in_RDI->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0xf) = uStack_10;
  (((vector<uint256,_std::allocator<uint256>_> *)&in_RDI->version)->
  super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.super__Vector_impl_data._M_start =
       local_28;
  *(pointer *)&in_RDI->m_has_witness = puStack_20;
  (in_RDI->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = local_38;
  (in_RDI->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pCStack_30;
  (in_RDI->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_48;
  (in_RDI->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = pCStack_40;
  (in_RDI->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = local_58;
  (((vector<bool,_std::allocator<bool>_> *)
   &(in_RDI->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish)->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = p_Stack_50;
  vMatch_00 = &local_80;
  ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffe78);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffe78);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_fffffffffffffe78);
  std::vector<bool,_std::allocator<bool>_>::reserve
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffe88,
             (size_type)in_stack_fffffffffffffe80);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_fffffffffffffe78);
  std::vector<uint256,_std::allocator<uint256>_>::reserve
            ((vector<uint256,_std::allocator<uint256>_> *)vMatch_00,in_stack_fffffffffffffeb0);
  uVar4 = 0;
  do {
    uVar1 = (ulong)uVar4;
    sVar2 = std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_fffffffffffffe78);
    if (sVar2 <= uVar1) {
      CPartialMerkleTree::CPartialMerkleTree
                ((CPartialMerkleTree *)in_RDI,(vector<uint256,_std::allocator<uint256>_> *)vTxid,
                 vMatch_00);
      CPartialMerkleTree::operator=((CPartialMerkleTree *)in_stack_fffffffffffffe88,&local_d0);
      CPartialMerkleTree::~CPartialMerkleTree((CPartialMerkleTree *)in_stack_fffffffffffffe78);
      std::vector<uint256,_std::allocator<uint256>_>::~vector
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffe88);
      ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffe78);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffe88,(size_type)in_stack_fffffffffffffe80);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffe78);
    CTransaction::GetHash(in_stack_fffffffffffffe78);
    if ((in_RCX == 0) ||
       (sVar3 = std::
                set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                ::count((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                         *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80), sVar3 == 0)) {
      if (in_RDX != (uint *)0x0) {
        in_stack_fffffffffffffe90 = in_RDX;
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)in_stack_fffffffffffffe88,(size_type)in_stack_fffffffffffffe80);
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffe88);
        in_stack_fffffffffffffe9f =
             CBloomFilter::IsRelevantAndUpdate
                       ((CBloomFilter *)CONCAT44(uVar4,in_stack_ffffffffffffff10),tx);
        if ((bool)in_stack_fffffffffffffe9f) {
          ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)
                     CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                     SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0));
          std::
          vector<std::pair<unsigned_int,uint256>,std::allocator<std::pair<unsigned_int,uint256>>>::
          emplace_back<unsigned_int&,transaction_identifier<false>const&>
                    ((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                     in_stack_fffffffffffffe90,
                     (transaction_identifier<false> *)in_stack_fffffffffffffe88);
          goto LAB_006824e5;
        }
      }
      ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0));
    }
    else {
      ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0));
    }
LAB_006824e5:
    in_stack_fffffffffffffe88 =
         (CBlock *)
         transaction_identifier::operator_cast_to_uint256_
                   ((transaction_identifier<false> *)in_stack_fffffffffffffe78);
    std::vector<uint256,_std::allocator<uint256>_>::push_back
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffe88,
               &in_stack_fffffffffffffe80->m_wrapped);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

CMerkleBlock::CMerkleBlock(const CBlock& block, CBloomFilter* filter, const std::set<Txid>* txids)
{
    header = block.GetBlockHeader();

    std::vector<bool> vMatch;
    std::vector<uint256> vHashes;

    vMatch.reserve(block.vtx.size());
    vHashes.reserve(block.vtx.size());

    for (unsigned int i = 0; i < block.vtx.size(); i++)
    {
        const Txid& hash{block.vtx[i]->GetHash()};
        if (txids && txids->count(hash)) {
            vMatch.push_back(true);
        } else if (filter && filter->IsRelevantAndUpdate(*block.vtx[i])) {
            vMatch.push_back(true);
            vMatchedTxn.emplace_back(i, hash);
        } else {
            vMatch.push_back(false);
        }
        vHashes.push_back(hash);
    }

    txn = CPartialMerkleTree(vHashes, vMatch);
}